

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O3

void __thiscall QTimeEdit::QTimeEdit(QTimeEdit *this,QWidget *parent)

{
  undefined4 *puVar1;
  long in_FS_OFFSET;
  code *local_70;
  ImplFn local_68;
  QObject local_60 [12];
  QTime local_54;
  QVariant local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  QTime::QTime(&local_54,0,0,0,0);
  ::QVariant::QVariant(&local_50,local_54);
  QDateTimeEdit::QDateTimeEdit(&this->super_QDateTimeEdit,&local_50,QTime,parent);
  ::QVariant::~QVariant(&local_50);
  *(undefined ***)&(this->super_QDateTimeEdit).super_QAbstractSpinBox.super_QWidget =
       &PTR_metaObject_007f1140;
  *(undefined ***)
   &(this->super_QDateTimeEdit).super_QAbstractSpinBox.super_QWidget.super_QPaintDevice =
       &PTR__QTimeEdit_007f1330;
  local_70 = userTimeChanged;
  local_68 = (ImplFn)0x0;
  local_50.d.data.shared = (PrivateShared *)QDateTimeEdit::timeChanged;
  local_50.d.data._8_8_ = 0;
  puVar1 = (undefined4 *)operator_new(0x20);
  *puVar1 = 1;
  *(code **)(puVar1 + 2) =
       QtPrivate::QCallableObject<void_(QTimeEdit::*)(QTime),_QtPrivate::List<QTime>,_void>::impl;
  *(code **)(puVar1 + 4) = userTimeChanged;
  *(undefined8 *)(puVar1 + 6) = 0;
  QObject::connectImpl
            (local_60,(void **)this,(QObject *)&local_50,(void **)this,(QSlotObjectBase *)&local_70,
             (ConnectionType)puVar1,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_60);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QTimeEdit::QTimeEdit(QWidget *parent)
    : QDateTimeEdit(QDATETIMEEDIT_TIME_MIN, QMetaType::QTime, parent)
{
    connect(this, &QTimeEdit::timeChanged, this, &QTimeEdit::userTimeChanged);
}